

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O1

char * lua_pushstring(lua_State *L,char *s)

{
  StkId pTVar1;
  TString *pTVar2;
  TString *x_;
  
  if (s == (char *)0x0) {
    L->top->tt_ = 0;
    pTVar2 = (TString *)0x0;
  }
  else {
    pTVar2 = luaS_new(L,s);
    pTVar1 = L->top;
    (pTVar1->value_).gc = (GCObject *)pTVar2;
    pTVar1->tt_ = pTVar2->tt | 0x40;
    pTVar2 = pTVar2 + 1;
  }
  L->top = L->top + 1;
  if (0 < L->l_G->GCdebt) {
    luaC_step(L);
  }
  return (char *)pTVar2;
}

Assistant:

LUA_API const char *lua_pushstring (lua_State *L, const char *s) {
  lua_lock(L);
  if (s == NULL)
    setnilvalue(s2v(L->top));
  else {
    TString *ts;
    ts = luaS_new(L, s);
    setsvalue2s(L, L->top, ts);
    s = getstr(ts);  /* internal copy's address */
  }
  api_incr_top(L);
  luaC_checkGC(L);
  lua_unlock(L);
  return s;
}